

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O1

void __thiscall raft_functional_common::TestSm::~TestSm(TestSm *this)

{
  ~TestSm(this);
  operator_delete(this);
  return;
}

Assistant:

~TestSm() {}